

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O1

bool __thiscall
google::protobuf::MessageLite::AppendPartialToString(MessageLite *this,string *output)

{
  size_type sVar1;
  int iVar2;
  undefined4 extraout_var;
  LogMessage *pLVar3;
  pointer pcVar4;
  LogFinisher local_89;
  string local_88;
  pointer local_68;
  char *local_60;
  undefined8 local_38;
  undefined2 local_30;
  byte local_2e;
  ulong value;
  
  sVar1 = output->_M_string_length;
  iVar2 = (*this->_vptr_MessageLite[9])();
  value = CONCAT44(extraout_var,iVar2);
  if ((value & 0xffffffff80000000) == 0) {
    std::__cxx11::string::resize((ulong)output,(char)iVar2 + (char)sVar1);
    pcVar4 = (output->_M_dataplus)._M_p + sVar1;
    local_2e = io::CodedOutputStream::default_serialization_deterministic_ & 1;
    local_68 = pcVar4 + value;
    local_60 = (char *)0x0;
    local_38 = 0;
    local_30 = 0;
    (*this->_vptr_MessageLite[0xc])(this,pcVar4);
  }
  else {
    internal::LogMessage::LogMessage
              ((LogMessage *)&local_68,LOGLEVEL_DFATAL,
               "third_party/sentencepiece/third_party/protobuf-lite/message_lite.cc",0x1c9);
    (*this->_vptr_MessageLite[2])(&local_88,this);
    pLVar3 = internal::LogMessage::operator<<((LogMessage *)&local_68,&local_88);
    pLVar3 = internal::LogMessage::operator<<(pLVar3," exceeded maximum protobuf size of 2GB: ");
    pLVar3 = internal::LogMessage::operator<<(pLVar3,value);
    internal::LogFinisher::operator=(&local_89,pLVar3);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    internal::LogMessage::~LogMessage((LogMessage *)&local_68);
  }
  return value >> 0x1f == 0;
}

Assistant:

bool MessageLite::AppendPartialToString(std::string* output) const {
  size_t old_size = output->size();
  size_t byte_size = ByteSizeLong();
  if (byte_size > INT_MAX) {
    GOOGLE_LOG(ERROR) << GetTypeName()
               << " exceeded maximum protobuf size of 2GB: " << byte_size;
    return false;
  }

  STLStringResizeUninitialized(output, old_size + byte_size);
  uint8* start =
      reinterpret_cast<uint8*>(io::mutable_string_data(output) + old_size);
  SerializeToArrayImpl(*this, start, byte_size);
  return true;
}